

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O0

ValueRangeAccess * __thiscall
rsg::ValueRangeAccess::member
          (ValueRangeAccess *__return_storage_ptr__,ValueRangeAccess *this,int memberNdx)

{
  int iVar1;
  vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_> *this_00;
  const_reference this_01;
  VariableType *type;
  int offset;
  int memberNdx_local;
  ValueRangeAccess *this_local;
  
  iVar1 = VariableType::getMemberScalarOffset((this->super_ConstValueRangeAccess).m_type,memberNdx);
  this_00 = VariableType::getMembers((this->super_ConstValueRangeAccess).m_type);
  this_01 = std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::
            operator[](this_00,(long)memberNdx);
  type = VariableType::Member::getType(this_01);
  ValueRangeAccess(__return_storage_ptr__,type,(this->super_ConstValueRangeAccess).m_min + iVar1,
                   (this->super_ConstValueRangeAccess).m_max + iVar1);
  return __return_storage_ptr__;
}

Assistant:

inline ValueRangeAccess ValueRangeAccess::member (int memberNdx)
{
	int offset = m_type->getMemberScalarOffset(memberNdx);
	return ValueRangeAccess(m_type->getMembers()[memberNdx].getType(), m_min + offset, m_max + offset);
}